

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

void __thiscall xscript::parser::ast::next(ast *this)

{
  undefined4 uVar1;
  bool bVar2;
  bool local_6a;
  bool local_69;
  token local_58;
  token local_40;
  undefined1 local_28 [8];
  token token;
  ast *this_local;
  
  token.literal._M_str = (char *)this;
  do {
    tokenizer::scanner::next((token *)local_28,&this->scanner);
    switch(local_28._0_4_) {
    case 1:
      bVar2 = tokenizer::token::operator==(&this->cur_token,TK_EOF);
      if (!bVar2) {
switchD_001449eb_caseD_5:
        uVar1 = *(undefined4 *)&(this->cur_token).field_0x4;
        (this->prev_token).type = (this->cur_token).type;
        *(undefined4 *)&(this->prev_token).field_0x4 = uVar1;
        (this->prev_token).literal._M_len = (this->cur_token).literal._M_len;
        (this->prev_token).literal._M_str = (this->cur_token).literal._M_str;
        *(undefined1 (*) [8])&this->cur_token = local_28;
        (this->cur_token).literal._M_len = token._0_8_;
        (this->cur_token).literal._M_str = (char *)token.literal._M_len;
      }
      return;
    case 2:
      next_line(this);
      break;
    case 3:
      while( true ) {
        bVar2 = tokenizer::token::operator!=((token *)local_28,TK_EOF);
        local_69 = false;
        if (bVar2) {
          local_69 = tokenizer::token::operator!=((token *)local_28,TK_EOL);
        }
        if (local_69 == false) break;
        tokenizer::scanner::next(&local_40,&this->scanner);
        local_28 = (undefined1  [8])local_40._0_8_;
        token._0_8_ = local_40.literal._M_len;
        token.literal._M_len = (size_t)local_40.literal._M_str;
        bVar2 = tokenizer::token::operator==((token *)local_28,TK_EOL);
        if (bVar2) {
          next_line(this);
        }
      }
      break;
    case 4:
      while( true ) {
        bVar2 = tokenizer::token::operator!=((token *)local_28,TK_EOF);
        local_6a = false;
        if (bVar2) {
          local_6a = tokenizer::token::operator!=((token *)local_28,TK_COMMENT_END);
        }
        if (local_6a == false) break;
        tokenizer::scanner::next(&local_58,&this->scanner);
        local_28 = (undefined1  [8])local_58._0_8_;
        token._0_8_ = local_58.literal._M_len;
        token.literal._M_len = (size_t)local_58.literal._M_str;
        bVar2 = tokenizer::token::operator==((token *)local_28,TK_EOL);
        if (bVar2) {
          next_line(this);
        }
      }
      break;
    default:
      goto switchD_001449eb_caseD_5;
    case 6:
    case 7:
    }
  } while( true );
}

Assistant:

void ast::next() {
    while (true) {
        tokenizer::token token = scanner.next();
        switch (token.type) {
            case tokenizer::TK_SPACE:
            case tokenizer::TK_TAB:
                // 忽略空格与制表符
                break;
            case tokenizer::TK_COMMENT_LINE:
                // 跳过单行注释
                while (token != tokenizer::TK_EOF && token != tokenizer::TK_EOL) {
                    token = scanner.next();
                    if (token == tokenizer::TK_EOL) {
                        next_line();
                    }
                }
                break;
            case tokenizer::TK_COMMENT_BEGIN:
                // 跳过多行注释
                while (token != tokenizer::TK_EOF && token != tokenizer::TK_COMMENT_END) {
                    token = scanner.next();
                    if (token == tokenizer::TK_EOL) {
                        next_line();
                    }
                }
                break;
            case tokenizer::TK_EOL:
                // 忽略换行
                next_line();
                break;
            case tokenizer::TK_EOF:
                // 扫描结束
                if (cur_token == tokenizer::TK_EOF) {
                    return;
                }
            default:
                prev_token = cur_token;
                cur_token = token;
                return;
        }
    }
}